

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegion_conflict *
address_space_translate_cached
          (MemoryRegionCache *cache,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool is_write,
          MemTxAttrs attrs)

{
  MemoryRegionSection local_e8;
  AddressSpace *local_a0;
  AddressSpace *target_as;
  IOMMUMemoryRegion *iommu_mr;
  MemoryRegion_conflict *mr;
  MemoryRegionSection section;
  _Bool is_write_local;
  hwaddr *plen_local;
  hwaddr *xlat_local;
  hwaddr addr_local;
  MemoryRegionCache *cache_local;
  IOMMUMemoryRegion *pIStack_10;
  MemTxAttrs attrs_local;
  
  if (cache->ptr == (void *)0x0) {
    *xlat = addr + cache->xlat;
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    target_as = (AddressSpace *)memory_region_get_iommu((MemoryRegion_conflict *)iommu_mr);
    if ((IOMMUMemoryRegion *)target_as == (IOMMUMemoryRegion *)0x0) {
      pIStack_10 = iommu_mr;
    }
    else {
      address_space_translate_iommu
                (&local_e8,(IOMMUMemoryRegion *)target_as,xlat,plen,(hwaddr *)0x0,is_write,true,
                 &local_a0,attrs);
      memcpy(&mr,&local_e8,0x40);
      pIStack_10 = section.size._8_8_;
    }
    return (MemoryRegion_conflict *)pIStack_10;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

static inline MemoryRegion *address_space_translate_cached(
    MemoryRegionCache *cache, hwaddr addr, hwaddr *xlat,
    hwaddr *plen, bool is_write, MemTxAttrs attrs)
{
    MemoryRegionSection section;
    MemoryRegion *mr;
    IOMMUMemoryRegion *iommu_mr;
    AddressSpace *target_as;

    assert(!cache->ptr);
    *xlat = addr + cache->xlat;

    mr = cache->mrs.mr;
    iommu_mr = memory_region_get_iommu(mr);
    if (!iommu_mr) {
        /* MMIO region.  */
        return mr;
    }

    section = address_space_translate_iommu(iommu_mr, xlat, plen,
                                            NULL, is_write, true,
                                            &target_as, attrs);
    return section.mr;
}